

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strings.c
# Opt level: O3

STRING_HANDLE STRING_construct_n(char *psz,size_t n)

{
  size_t sVar1;
  LOGGER_LOG p_Var2;
  STRING_HANDLE __ptr;
  int iVar3;
  char *pcVar4;
  size_t __size;
  
  if (psz == (char *)0x0) {
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 != (LOGGER_LOG)0x0) {
      pcVar4 = "invalid arg (NULL)";
      iVar3 = 0x2f1;
LAB_0010eaab:
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/deps/azure-c-shared-utility/src/strings.c"
                ,"STRING_construct_n",iVar3,1,pcVar4);
      return (STRING_HANDLE)0x0;
    }
  }
  else {
    sVar1 = strlen(psz);
    if (sVar1 < n) {
      p_Var2 = xlogging_get_log_function();
      if (p_Var2 != (LOGGER_LOG)0x0) {
        pcVar4 = "invalig arg (n is bigger than the size of the string)";
        iVar3 = 0x2fa;
        goto LAB_0010eaab;
      }
    }
    else {
      __ptr = (STRING_HANDLE)malloc(8);
      if (__ptr != (STRING_HANDLE)0x0) {
        __size = 0xffffffffffffffff;
        if (sVar1 + 1 != 0) {
          __size = sVar1 + 1;
        }
        if (__size != 0xffffffffffffffff) {
          pcVar4 = (char *)malloc(__size);
          __ptr->s = pcVar4;
          if (pcVar4 != (char *)0x0) {
            memcpy(pcVar4,psz,n);
            pcVar4[n] = '\0';
            return __ptr;
          }
        }
        p_Var2 = xlogging_get_log_function();
        if (p_Var2 != (LOGGER_LOG)0x0) {
          (*p_Var2)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/deps/azure-c-shared-utility/src/strings.c"
                    ,"STRING_construct_n",0x30c,1,"Failure allocating value. size=%zu",__size);
        }
        free(__ptr);
      }
    }
  }
  return (STRING_HANDLE)0x0;
}

Assistant:

STRING_HANDLE STRING_construct_n(const char* psz, size_t n)
{
    STRING_HANDLE result;
    /*Codes_SRS_STRING_02_008: [If psz is NULL then STRING_construct_n shall return NULL.] */
    if (psz == NULL)
    {
        result = NULL;
        LogError("invalid arg (NULL)");
    }
    else
    {
        size_t len = strlen(psz);
        /*Codes_SRS_STRING_02_009: [If n is bigger than the size of the string psz, then STRING_construct_n shall return NULL.] */
        if (n > len)
        {
            result = NULL;
            LogError("invalig arg (n is bigger than the size of the string)");
        }
        else
        {
            STRING* str;
            if ((str = (STRING*)malloc(sizeof(STRING))) != NULL)
            {
                size_t malloc_size = safe_add_size_t(len, 1);
                if (malloc_size != SIZE_MAX &&
                    (str->s = (char*)malloc(malloc_size)) != NULL)
                {
                    (void)memcpy(str->s, psz, n);
                    str->s[n] = '\0';
                    result = (STRING_HANDLE)str;
                }
                /* Codes_SRS_STRING_02_010: [In all other error cases, STRING_construct_n shall return NULL.]  */
                else
                {
                    LogError("Failure allocating value. size=%zu", malloc_size);
                    free(str);
                    result = NULL;
                }
            }
            else
            {
                /* Codes_SRS_STRING_02_010: [In all other error cases, STRING_construct_n shall return NULL.]  */
                result = NULL;
            }
        }
    }
    return result;
}